

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitObjectInitializers
               (ParseNode *memberList,RegSlot objectLocation,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  ParseNode *this;
  PropertyIdArray *obj;
  OpCode OVar1;
  bool bVar2;
  BOOL BVar3;
  uint C1;
  uint32 byteCount;
  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  ParseNodeBin *pPVar4;
  ParseNodeStr *pPVar5;
  FunctionBody *this_01;
  uint uVar6;
  ParseNodePtr pPVar7;
  undefined8 uVar8;
  ulong uVar9;
  bool useStore;
  bool *in_stack_ffffffffffffff88;
  int local_6c;
  ulong local_68;
  undefined8 local_60;
  PropertyIdArray *local_58;
  FuncInfo *local_50;
  ByteCodeWriter *local_48;
  uint32 local_3c;
  RegSlot local_38;
  uint32 value;
  PropertyId propertyId;
  
  uVar8 = 0;
  local_50 = funcInfo;
  local_38 = objectLocation;
  this_00 = (BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::ArenaAllocator>(0x38,byteCodeGenerator->alloc,0x35916e);
  JsUtil::
  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,byteCodeGenerator->alloc,0x11);
  if (memberList != (ParseNode *)0x0) {
    pPVar7 = memberList;
    while (OVar1 = pPVar7->nop, OVar1 == knopList) {
      pPVar4 = ParseNode::AsParseNodeBin(pPVar7);
      if (pPVar4->pnode1->nop == knopEllipsis) {
LAB_0076bc7b:
        OVar1 = pPVar7->nop;
        uVar8 = CONCAT71((int7)((ulong)&local_3c >> 8),1);
        goto LAB_0076bc85;
      }
      pPVar4 = ParseNode::AsParseNodeBin(pPVar7);
      pPVar4 = ParseNode::AsParseNodeBin(pPVar4->pnode1);
      if (pPVar4->pnode1->nop == knopComputedName) goto LAB_0076bc7b;
      pPVar4 = ParseNode::AsParseNodeBin(pPVar7);
      pPVar4 = ParseNode::AsParseNodeBin(pPVar4->pnode1);
      pPVar5 = ParseNode::AsParseNodeStr(pPVar4->pnode1);
      value = pPVar5->pid->m_propertyId;
      BVar3 = Js::ScriptContext::IsNumericPropertyId
                        (byteCodeGenerator->scriptContext,value,&local_3c);
      if (BVar3 == 0) {
        JsUtil::
        BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Item((BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                *)this_00,(int *)&value);
      }
      pPVar4 = ParseNode::AsParseNodeBin(pPVar7);
      pPVar7 = pPVar4->pnode2;
    }
    uVar8 = 0;
LAB_0076bc85:
    if (((OVar1 != knopEllipsis) &&
        (pPVar4 = ParseNode::AsParseNodeBin(pPVar7), pPVar4->pnode1->nop != knopComputedName)) &&
       ((char)uVar8 == '\0')) {
      pPVar4 = ParseNode::AsParseNodeBin(pPVar7);
      pPVar5 = ParseNode::AsParseNodeStr(pPVar4->pnode1);
      value = pPVar5->pid->m_propertyId;
      BVar3 = Js::ScriptContext::IsNumericPropertyId
                        (byteCodeGenerator->scriptContext,value,&local_3c);
      if (BVar3 == 0) {
        JsUtil::
        BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Item((BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                *)this_00,(int *)&value);
      }
    }
  }
  if (memberList != (ParseNode *)0x0) {
    if (this_00->count != this_00->freeCount) {
      uVar6 = this_00->count - this_00->freeCount;
      local_60 = uVar8;
      if (0x3fffffff < uVar6) {
        Math::DefaultOverflowPolicy();
      }
      local_68 = (ulong)(uVar6 * 4);
      uVar9 = 0;
      local_58 = (PropertyIdArray *)
                 new<Memory::ArenaAllocator>(8,byteCodeGenerator->alloc,0x35916e,0);
      local_58->count = uVar6;
      local_58->extraSlots = '\0';
      local_58->hadDuplicates = false;
      local_58->has__proto__ = false;
      local_58->hasNonSimpleParams = false;
      local_6c = 0x1eb;
      local_48 = (ByteCodeWriter *)this_00;
      bVar2 = JsUtil::
              BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(this_00,&local_6c);
      pPVar7 = memberList;
      if (bVar2) {
        local_58->has__proto__ = true;
      }
      while( true ) {
        OVar1 = pPVar7->nop;
        if (OVar1 != knopList) break;
        pPVar4 = ParseNode::AsParseNodeBin(pPVar7);
        if (pPVar4->pnode1->nop == knopEllipsis) {
LAB_0076be0d:
          OVar1 = pPVar7->nop;
          break;
        }
        pPVar4 = ParseNode::AsParseNodeBin(pPVar7);
        pPVar4 = ParseNode::AsParseNodeBin(pPVar4->pnode1);
        if (pPVar4->pnode1->nop == knopComputedName) goto LAB_0076be0d;
        pPVar4 = ParseNode::AsParseNodeBin(pPVar7);
        pPVar4 = ParseNode::AsParseNodeBin(pPVar4->pnode1);
        pPVar5 = ParseNode::AsParseNodeStr(pPVar4->pnode1);
        value = pPVar5->pid->m_propertyId;
        BVar3 = Js::ScriptContext::IsNumericPropertyId
                          (byteCodeGenerator->scriptContext,value,&local_3c);
        if ((BVar3 == 0) &&
           (bVar2 = JsUtil::
                    BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    ::Remove((BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                              *)local_48,(int *)&value), bVar2)) {
          (&local_58[1].count)[uVar9] = value;
          uVar9 = (ulong)((int)uVar9 + 1);
        }
        pPVar4 = ParseNode::AsParseNodeBin(pPVar7);
        pPVar7 = pPVar4->pnode2;
      }
      if (((OVar1 != knopEllipsis) &&
          (pPVar4 = ParseNode::AsParseNodeBin(pPVar7), pPVar4->pnode1->nop != knopComputedName)) &&
         ((char)local_60 == '\0')) {
        pPVar4 = ParseNode::AsParseNodeBin(pPVar7);
        pPVar5 = ParseNode::AsParseNodeStr(pPVar4->pnode1);
        value = pPVar5->pid->m_propertyId;
        BVar3 = Js::ScriptContext::IsNumericPropertyId
                          (byteCodeGenerator->scriptContext,value,&local_3c);
        if ((BVar3 == 0) &&
           (bVar2 = JsUtil::
                    BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    ::Remove((BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                              *)local_48,(int *)&value), bVar2)) {
          (&local_58[1].count)[uVar9] = value;
        }
      }
      this_01 = FuncInfo::GetParsedFunctionBody(local_50);
      C1 = Js::FunctionBody::NewObjectLiteral(this_01);
      uVar9 = local_68;
      byteCount = UInt32Math::Add(8,(uint32)local_68);
      obj = local_58;
      Js::ByteCodeWriter::Auxiliary
                (&byteCodeGenerator->m_writer,NewScObjectLiteral,local_38,local_58,byteCount,C1);
      Memory::
      DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseHashSet<int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,int,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>>
                (byteCodeGenerator->alloc,
                 (BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)local_48);
      Memory::
      DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::PropertyIdArray>
                (byteCodeGenerator->alloc,obj,uVar9);
      goto LAB_0076bed1;
    }
  }
  Js::ByteCodeWriter::Reg1(&byteCodeGenerator->m_writer,NewScObjectSimple,local_38);
LAB_0076bed1:
  if (memberList != (ParseNode *)0x0) {
    local_48 = &byteCodeGenerator->m_writer;
    bVar2 = false;
    while (memberList->nop == knopList) {
      pPVar4 = ParseNode::AsParseNodeBin(memberList);
      this = pPVar4->pnode1;
      if (this->nop == knopEllipsis) {
        ByteCodeGenerator::StartSubexpression(byteCodeGenerator,this);
        EmitObjectSpreadNode(this,local_38,byteCodeGenerator,local_50);
        useStore = bVar2;
      }
      else {
        pPVar4 = ParseNode::AsParseNodeBin(this);
        useStore = true;
        if (pPVar4->pnode1->nop != knopComputedName) {
          useStore = bVar2;
        }
        ByteCodeGenerator::StartSubexpression(byteCodeGenerator,this);
        EmitMemberNode(this,local_38,byteCodeGenerator,local_50,(ParseNode *)0x0,useStore,
                       in_stack_ffffffffffffff88);
      }
      Js::ByteCodeWriter::EndSubexpression(local_48,this);
      pPVar4 = ParseNode::AsParseNodeBin(memberList);
      bVar2 = useStore;
      memberList = pPVar4->pnode2;
    }
    ByteCodeGenerator::StartSubexpression(byteCodeGenerator,memberList);
    if (memberList->nop == knopEllipsis) {
      EmitObjectSpreadNode(memberList,local_38,byteCodeGenerator,local_50);
    }
    else {
      EmitMemberNode(memberList,local_38,byteCodeGenerator,local_50,(ParseNode *)0x0,bVar2,
                     in_stack_ffffffffffffff88);
    }
    Js::ByteCodeWriter::EndSubexpression(local_48,memberList);
  }
  return;
}

Assistant:

void EmitObjectInitializers(ParseNode *memberList, Js::RegSlot objectLocation, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    ParseNode *pmemberList = memberList;
    unsigned int argCount = 0;
    uint32  value;
    Js::PropertyId propertyId;

    //
    // 1. Add all non-int property ids to a dictionary propertyIds with value true
    // 2. Get the count of propertyIds
    // 3. Create a propertyId array of size count
    // 4. Put the propIds in the auxiliary area
    // 5. Get the objectLiteralCacheId
    // 6. Generate propId inits with values
    //

    // Handle propertyId collision
    typedef JsUtil::BaseHashSet<Js::PropertyId, ArenaAllocator, PowerOf2SizePolicy> PropertyIdSet;
    PropertyIdSet* propertyIds = Anew(byteCodeGenerator->GetAllocator(), PropertyIdSet, byteCodeGenerator->GetAllocator(), 17);

    bool hasComputedNameOrSpread = false;
    if (memberList != nullptr)
    {
        while (memberList->nop == knopList)
        {
            if (memberList->AsParseNodeBin()->pnode1->nop == knopEllipsis || memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->nop == knopComputedName)
            {
                hasComputedNameOrSpread = true;
                break;
            }

            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value))
            {
                propertyIds->Item(propertyId);
            }

            memberList = memberList->AsParseNodeBin()->pnode2;
        }

        if (memberList->nop != knopEllipsis && memberList->AsParseNodeBin()->pnode1->nop != knopComputedName && !hasComputedNameOrSpread)
        {
            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value))
            {
                propertyIds->Item(propertyId);
            }
        }
    }

    argCount = propertyIds->Count();

    memberList = pmemberList;
    if ((memberList == nullptr) || (argCount == 0))
    {
        // Empty literal or numeric property only object literal
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::NewScObjectSimple, objectLocation);
    }
    else
    {
        uint32 allocSize = UInt32Math::Mul(argCount, sizeof(Js::PropertyId));
        Js::PropertyIdArray *propIds = AnewPlus(byteCodeGenerator->GetAllocator(), allocSize, Js::PropertyIdArray, argCount, 0);

        if (propertyIds->ContainsKey(Js::PropertyIds::__proto__))
        {
            // Always record whether the initializer contains __proto__ no matter if current environment has it enabled
            // or not, in case the bytecode is later run with __proto__ enabled.
            propIds->has__proto__ = true;
        }

        unsigned int argIndex = 0;
        while (memberList->nop == knopList)
        {
            if (memberList->AsParseNodeBin()->pnode1->nop == knopEllipsis || memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->nop == knopComputedName)
            {
                break;
            }
            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value) && propertyIds->Remove(propertyId))
            {
                propIds->elements[argIndex] = propertyId;
                argIndex++;
            }
            memberList = memberList->AsParseNodeBin()->pnode2;
        }

        if (memberList->nop != knopEllipsis && memberList->AsParseNodeBin()->pnode1->nop != knopComputedName && !hasComputedNameOrSpread)
        {
            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value) && propertyIds->Remove(propertyId))
            {
                propIds->elements[argIndex] = propertyId;
                argIndex++;
            }
        }

        uint32 literalObjectId = funcInfo->GetParsedFunctionBody()->NewObjectLiteral();

        // Generate the opcode with propIds and cacheId
        byteCodeGenerator->Writer()->Auxiliary(Js::OpCode::NewScObjectLiteral, objectLocation, propIds, UInt32Math::Add(sizeof(Js::PropertyIdArray), allocSize), literalObjectId);

        Adelete(byteCodeGenerator->GetAllocator(), propertyIds);

        AdeletePlus(byteCodeGenerator->GetAllocator(), allocSize, propIds);
    }

    memberList = pmemberList;

    bool useStore = false;
    // Generate the actual assignment to those properties
    if (memberList != nullptr)
    {
        while (memberList->nop == knopList)
        {
            ParseNode *memberNode = memberList->AsParseNodeBin()->pnode1;
            if (memberNode->nop == knopEllipsis) 
            {
                byteCodeGenerator->StartSubexpression(memberNode);
                EmitObjectSpreadNode(memberNode, objectLocation, byteCodeGenerator, funcInfo);
                byteCodeGenerator->EndSubexpression(memberNode);
            }
            else
            {
                if (memberNode->AsParseNodeBin()->pnode1->nop == knopComputedName)
                {
                    useStore = true;
                }

                byteCodeGenerator->StartSubexpression(memberNode);
                EmitMemberNode(memberNode, objectLocation, byteCodeGenerator, funcInfo, nullptr, useStore);
                byteCodeGenerator->EndSubexpression(memberNode);
            }
            memberList = memberList->AsParseNodeBin()->pnode2;
        }

        byteCodeGenerator->StartSubexpression(memberList);
        if (memberList->nop == knopEllipsis)
        {
            EmitObjectSpreadNode(memberList, objectLocation, byteCodeGenerator, funcInfo);
        }
        else
        {
            EmitMemberNode(memberList, objectLocation, byteCodeGenerator, funcInfo, nullptr, useStore);
        }
        byteCodeGenerator->EndSubexpression(memberList);
    }
}